

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherInotify.cpp
# Opt level: O1

bool __thiscall efsw::FileWatcherInotify::pathInWatches(FileWatcherInotify *this,string *path)

{
  pointer __s2;
  _Base_ptr p_Var1;
  _Base_ptr __n;
  int iVar2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  bool bVar5;
  
  Mutex::lock(&this->mRealWatchesLock);
  p_Var3 = (this->mRealWatches)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(this->mRealWatches)._M_t._M_impl.super__Rb_tree_header;
  bVar5 = (_Rb_tree_header *)p_Var3 != p_Var4;
  if (bVar5) {
    __s2 = (path->_M_dataplus)._M_p;
    p_Var1 = (_Base_ptr)path->_M_string_length;
    do {
      __n = (p_Var3[1]._M_parent)->_M_right;
      if (__n == p_Var1) {
        if (__n == (_Base_ptr)0x0) break;
        iVar2 = bcmp((p_Var3[1]._M_parent)->_M_left,__s2,(size_t)__n);
        if (iVar2 == 0) break;
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      bVar5 = (_Rb_tree_header *)p_Var3 != p_Var4;
    } while (bVar5);
  }
  Mutex::unlock(&this->mRealWatchesLock);
  return bVar5;
}

Assistant:

bool FileWatcherInotify::pathInWatches( const std::string& path ) {
	Lock l( mRealWatchesLock );

	/// Search in the real watches, since it must allow adding a watch already watched as a subdir
	WatchMap::iterator it = mRealWatches.begin();

	for ( ; it != mRealWatches.end(); ++it )
		if ( it->second->Directory == path )
			return true;

	return false;
}